

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

int __thiscall
ON_PolyCurve::SegmentIndex
          (ON_PolyCurve *this,ON_Interval sub_domain,int *segment_index0,int *segment_index1)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  dVar7 = sub_domain.m_t[1];
  local_50.m_t[0] = sub_domain.m_t[0];
  iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_50.m_t[1] = dVar7;
  ON_Interval::ON_Interval(&local_60);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  local_40.m_t[1] = dVar7;
  ON_Interval::Intersection(&local_50,&local_40);
  bVar2 = ON_Interval::IsIncreasing(&local_50);
  iVar4 = 0;
  iVar6 = 0;
  if (bVar2) {
    dVar7 = ON_Interval::Min(&local_50);
    iVar4 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    iVar3 = ON_SearchMonotoneArray((this->m_t).m_a,(this->m_t).m_count,dVar7);
    iVar6 = iVar4 + -1;
    if (iVar3 < iVar4) {
      iVar6 = iVar3;
    }
    if (iVar3 < 0) {
      iVar6 = 0;
    }
    iVar4 = iVar6;
    do {
      iVar4 = iVar4 + 1;
      if (iVar1 <= iVar4) break;
      local_60 = SegmentDomain(this,iVar4);
      pdVar5 = ON_Interval::operator[](&local_60,0);
      dVar7 = *pdVar5;
      dVar8 = ON_Interval::Max(&local_50);
    } while (dVar7 < dVar8);
  }
  if (segment_index0 != (int *)0x0) {
    *segment_index0 = iVar6;
  }
  if (segment_index1 != (int *)0x0) {
    *segment_index1 = iVar4;
  }
  return iVar4 - iVar6;
}

Assistant:

int ON_PolyCurve::SegmentIndex(
  ON_Interval sub_domain,
  int* segment_index0,
  int* segment_index1
  ) const
{
  const int segment_count = m_segment.Count();
  int s0 = 0, s1 = 0;
  ON_Interval seg_dom;
  sub_domain.Intersection( Domain() );
  if ( sub_domain.IsIncreasing() )
  {
    s0 = SegmentIndex(sub_domain.Min());
    for ( s1 = s0+1; s1 < segment_count; s1++ )
    {
      seg_dom = SegmentDomain(s1);
      if ( seg_dom[0] >= sub_domain.Max() )
        break;
    }
  }
  if ( segment_index0 )
    *segment_index0 = s0;
  if ( segment_index1 )
    *segment_index1 = s1;
  return s1-s0;
}